

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QFileDialogPrivate::HistoryItem>::Inserter::insertOne
          (Inserter *this,qsizetype pos,HistoryItem *t)

{
  HistoryItem *pHVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  QPersistentModelIndex *pQVar6;
  HistoryItem *pHVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  
  pHVar1 = this->begin;
  lVar10 = this->size;
  pHVar7 = pHVar1 + lVar10;
  this->end = pHVar7;
  this->last = pHVar1 + lVar10 + -1;
  this->where = pHVar1 + pos;
  lVar10 = lVar10 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar10;
  this->sourceCopyAssign = 1;
  if (lVar10 < 1) {
    this->sourceCopyConstruct = 1 - lVar10;
    this->move = 0;
    this->sourceCopyAssign = lVar10;
  }
  if (this->sourceCopyConstruct != 0) {
    pDVar2 = (t->path).d.d;
    (t->path).d.d = (Data *)0x0;
    (pHVar7->path).d.d = pDVar2;
    pcVar3 = (t->path).d.ptr;
    (t->path).d.ptr = (char16_t *)0x0;
    (pHVar7->path).d.ptr = pcVar3;
    qVar4 = (t->path).d.size;
    (t->path).d.size = 0;
    (pHVar7->path).d.size = qVar4;
    pDVar5 = (t->selection).d.d;
    (t->selection).d.d = (Data *)0x0;
    (pHVar7->selection).d.d = pDVar5;
    pQVar6 = (t->selection).d.ptr;
    (t->selection).d.ptr = (QPersistentModelIndex *)0x0;
    (pHVar7->selection).d.ptr = pQVar6;
    qVar4 = (t->selection).d.size;
    (t->selection).d.size = 0;
    (pHVar7->selection).d.size = qVar4;
    this->size = this->size + 1;
    return;
  }
  pDVar2 = pHVar7[-1].path.d.d;
  pcVar3 = pHVar7[-1].path.d.ptr;
  pHVar7[-1].path.d.d = (Data *)0x0;
  pHVar7[-1].path.d.ptr = (char16_t *)0x0;
  (pHVar7->path).d.d = pDVar2;
  (pHVar7->path).d.ptr = pcVar3;
  qVar4 = pHVar7[-1].path.d.size;
  pHVar7[-1].path.d.size = 0;
  (pHVar7->path).d.size = qVar4;
  pDVar5 = pHVar7[-1].selection.d.d;
  pQVar6 = pHVar7[-1].selection.d.ptr;
  pHVar7[-1].selection.d.d = (Data *)0x0;
  pHVar7[-1].selection.d.ptr = (QPersistentModelIndex *)0x0;
  (pHVar7->selection).d.d = pDVar5;
  (pHVar7->selection).d.ptr = pQVar6;
  qVar4 = pHVar7[-1].selection.d.size;
  pHVar7[-1].selection.d.size = 0;
  (pHVar7->selection).d.size = qVar4;
  this->size = this->size + 1;
  if (this->move != 0) {
    lVar11 = 0x18;
    lVar10 = 0;
    do {
      pHVar7 = this->last;
      uVar8 = *(undefined8 *)((long)pHVar7 + lVar11 + -0x18);
      uVar9 = *(undefined8 *)((long)pHVar7 + lVar11 + -0x10);
      *(undefined8 *)((long)pHVar7 + lVar11 + -0x18) =
           *(undefined8 *)((long)pHVar7 + lVar11 + -0x48);
      *(undefined8 *)((long)pHVar7 + lVar11 + -0x10) =
           *(undefined8 *)((long)pHVar7 + lVar11 + -0x40);
      *(undefined8 *)((long)pHVar7 + lVar11 + -0x48) = uVar8;
      *(undefined8 *)((long)pHVar7 + lVar11 + -0x40) = uVar9;
      uVar8 = *(undefined8 *)((long)pHVar7 + lVar11 + -8);
      *(undefined8 *)((long)pHVar7 + lVar11 + -8) = *(undefined8 *)((long)pHVar7 + lVar11 + -0x38);
      *(undefined8 *)((long)pHVar7 + lVar11 + -0x38) = uVar8;
      QArrayDataPointer<QPersistentModelIndex>::operator=
                ((QArrayDataPointer<QPersistentModelIndex> *)((long)&(pHVar7->path).d.d + lVar11),
                 (QArrayDataPointer<QPersistentModelIndex> *)((long)&pHVar7[-1].path.d.d + lVar11));
      lVar10 = lVar10 + -1;
      lVar11 = lVar11 + -0x30;
    } while (lVar10 != this->move);
  }
  pHVar7 = this->where;
  pDVar2 = (pHVar7->path).d.d;
  (pHVar7->path).d.d = (t->path).d.d;
  (t->path).d.d = pDVar2;
  pcVar3 = (pHVar7->path).d.ptr;
  (pHVar7->path).d.ptr = (t->path).d.ptr;
  (t->path).d.ptr = pcVar3;
  qVar4 = (pHVar7->path).d.size;
  (pHVar7->path).d.size = (t->path).d.size;
  (t->path).d.size = qVar4;
  QArrayDataPointer<QPersistentModelIndex>::operator=(&(pHVar7->selection).d,&(t->selection).d);
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }